

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O2

void genNames(char *prefix,int index,string *textures_dir,string *material,string *image,
             string *image_file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  stringstream local_500 [8];
  stringstream s_file;
  ostream local_4f0 [8];
  string local_4e8 [368];
  stringstream local_378 [8];
  stringstream s_mat;
  ostream local_368 [8];
  string local_360 [368];
  stringstream local_1f0 [8];
  stringstream s_img;
  ostream local_1e0 [8];
  string local_1d8 [368];
  string *local_68;
  string *local_60;
  string *local_58;
  string local_50;
  
  local_68 = material;
  local_60 = image;
  local_58 = image_file;
  std::__cxx11::stringstream::stringstream(local_378);
  std::__cxx11::stringstream::stringstream(local_1f0);
  std::__cxx11::stringstream::stringstream(local_500);
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str(local_360);
  std::__cxx11::string::~string((string *)&local_50);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str(local_1d8);
  std::__cxx11::string::~string((string *)&local_50);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str(local_4e8);
  std::__cxx11::string::~string((string *)&local_50);
  poVar2 = std::operator<<(local_368,prefix);
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 6;
  poVar2 = std::operator<<(poVar2,0x30);
  std::__cxx11::to_string(&local_50,index);
  std::operator<<(poVar2,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  poVar2 = std::operator<<(local_1e0,prefix);
  std::__cxx11::to_string(&local_50,index);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  std::operator<<(poVar2,".jpg");
  std::__cxx11::string::~string((string *)&local_50);
  poVar2 = std::operator<<(local_4f0,(string *)textures_dir);
  std::__cxx11::stringbuf::str();
  std::operator<<(poVar2,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_68,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_60,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_58,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::stringstream::~stringstream(local_500);
  std::__cxx11::stringstream::~stringstream(local_1f0);
  std::__cxx11::stringstream::~stringstream(local_378);
  return;
}

Assistant:

void genNames(const char* prefix,
    const int index,
    const std::string & textures_dir,
    std::string & material,
    std::string & image,
    std::string & image_file)
{
    std::stringstream s_mat, s_img, s_file;
    s_mat.str(std::string());
    s_img.str(std::string());
    s_file.str(std::string());
    s_mat << prefix << std::setw(6) << std::setfill('0') << std::to_string(index);
    s_img << prefix << std::to_string(index) << IMG_EXT;
    s_file << textures_dir << s_img.str();

    material = s_mat.str();
    image = s_img.str();
    image_file = s_file.str();
}